

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseBalancedChunkMemoryRecover
              (xmlDocPtr doc,xmlSAXHandlerPtr sax,void *user_data,int depth,xmlChar *string,
              xmlNodePtr *listOut,int recover)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input_00;
  xmlNodePtr cur;
  int local_5c;
  int ret;
  xmlNodePtr list;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  xmlNodePtr *listOut_local;
  xmlChar *string_local;
  int depth_local;
  void *user_data_local;
  xmlSAXHandlerPtr sax_local;
  xmlDocPtr doc_local;
  
  if (listOut != (xmlNodePtr *)0x0) {
    *listOut = (xmlNodePtr)0x0;
  }
  if (string == (xmlChar *)0x0) {
    doc_local._4_4_ = 0x73;
  }
  else {
    ctxt_00 = xmlNewSAXParserCtxt(sax,user_data);
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      doc_local._4_4_ = 2;
    }
    else {
      xmlCtxtInitializeLate(ctxt_00);
      ctxt_00->depth = depth;
      ctxt_00->myDoc = doc;
      if (recover != 0) {
        ctxt_00->options = ctxt_00->options | 1;
        ctxt_00->recovery = 1;
      }
      input_00 = xmlNewStringInputStream(ctxt_00,string);
      if (input_00 == (xmlParserInputPtr)0x0) {
        local_5c = ctxt_00->errNo;
      }
      else {
        cur = xmlCtxtParseContentInternal(ctxt_00,input_00,0,1);
        if (listOut == (xmlNodePtr *)0x0) {
          xmlFreeNodeList(cur);
        }
        else {
          *listOut = cur;
        }
        if (ctxt_00->wellFormed == 0) {
          local_5c = ctxt_00->errNo;
        }
        else {
          local_5c = 0;
        }
      }
      xmlFreeInputStream(input_00);
      xmlFreeParserCtxt(ctxt_00);
      doc_local._4_4_ = local_5c;
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlParseBalancedChunkMemoryRecover(xmlDocPtr doc, xmlSAXHandlerPtr sax,
     void *user_data, int depth, const xmlChar *string, xmlNodePtr *listOut,
     int recover) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlNodePtr list;
    int ret;

    if (listOut != NULL)
        *listOut = NULL;

    if (string == NULL)
        return(XML_ERR_ARGUMENT);

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL)
        return(XML_ERR_NO_MEMORY);

    xmlCtxtInitializeLate(ctxt);

    ctxt->depth = depth;
    ctxt->myDoc = doc;
    if (recover) {
        ctxt->options |= XML_PARSE_RECOVER;
        ctxt->recovery = 1;
    }

    input = xmlNewStringInputStream(ctxt, string);
    if (input == NULL) {
        ret = ctxt->errNo;
        goto error;
    }

    list = xmlCtxtParseContentInternal(ctxt, input, /* hasTextDecl */ 0, 1);
    if (listOut != NULL)
        *listOut = list;
    else
        xmlFreeNodeList(list);

    if (!ctxt->wellFormed)
        ret = ctxt->errNo;
    else
        ret = XML_ERR_OK;

error:
    xmlFreeInputStream(input);
    xmlFreeParserCtxt(ctxt);
    return(ret);
}